

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O2

int32_t getTypeEnumForInputData(uint8_t *data,int32_t length,UErrorCode *pErrorCode)

{
  int iVar1;
  UDataInfo *pUVar2;
  int32_t headerLength;
  int32_t infoLength;
  
  pUVar2 = getDataInfo(data,length,&infoLength,&headerLength,pErrorCode);
  if (pUVar2 == (UDataInfo *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = (int)(char)pUVar2->isBigEndian + (uint)pUVar2->charsetFamily * 2;
  }
  return iVar1;
}

Assistant:

static int32_t
getTypeEnumForInputData(const uint8_t *data, int32_t length,
                        UErrorCode *pErrorCode) {
    const UDataInfo *pInfo;
    int32_t infoLength, headerLength;

    /* getDataInfo() checks for illegal arguments */
    pInfo=getDataInfo(data, length, infoLength, headerLength, pErrorCode);
    if(pInfo==NULL) {
        return -1;
    }

    return makeTypeEnum(pInfo->charsetFamily, (UBool)pInfo->isBigEndian);
}